

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O2

void extractPackageName(char *filename,char *pkg,int32_t capacity)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  uint uVar3;
  ulong __n;
  
  __s = findBasename(filename);
  sVar2 = strlen(__s);
  uVar3 = (uint)sVar2;
  if (4 < (int)uVar3) {
    __n = (ulong)(uVar3 - 4);
    iVar1 = strcmp(__s + __n,".dat");
    if (iVar1 == 0) {
      if (uVar3 < 0x44) {
        memcpy(pkg,__s,__n);
        pkg[__n] = '\0';
        return;
      }
      fprintf(_stderr,"icupkg: the package name \"%s\" is too long (>=%ld)\n",__s,0x40);
      goto LAB_001edab3;
    }
  }
  fprintf(_stderr,"icupkg: \"%s\" is not recognized as a package filename (must end with .dat)\n",
          __s);
LAB_001edab3:
  exit(1);
}

Assistant:

static void
extractPackageName(const char *filename,
                   char pkg[], int32_t capacity) {
    const char *basename;
    int32_t len;

    basename=findBasename(filename);
    len=(int32_t)strlen(basename)-4; /* -4: subtract the length of ".dat" */

    if(len<=0 || 0!=strcmp(basename+len, ".dat")) {
        fprintf(stderr, "icupkg: \"%s\" is not recognized as a package filename (must end with .dat)\n",
                         basename);
        exit(U_ILLEGAL_ARGUMENT_ERROR);
    }

    if(len>=capacity) {
        fprintf(stderr, "icupkg: the package name \"%s\" is too long (>=%ld)\n",
                         basename, (long)capacity);
        exit(U_ILLEGAL_ARGUMENT_ERROR);
    }

    memcpy(pkg, basename, len);
    pkg[len]=0;
}